

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O1

vm_obj_id_t CVmObjHTTPRequest::create(int in_root_set,TadsHttpRequest *req,vm_obj_id_t server)

{
  OS_Counter *pOVar1;
  vm_obj_id_t obj_id;
  int iVar2;
  undefined8 *puVar3;
  undefined4 extraout_var;
  undefined8 *puVar4;
  
  obj_id = CVmObjTable::alloc_obj(&G_obj_table_X,in_root_set,0,0);
  *(ushort *)&G_obj_table_X.pages_[obj_id >> 0xc][obj_id & 0xfff].field_0x14 =
       *(ushort *)&G_obj_table_X.pages_[obj_id >> 0xc][obj_id & 0xfff].field_0x14 | 0x80;
  puVar3 = (undefined8 *)CVmObject::operator_new(0x10,obj_id);
  *puVar3 = &PTR_get_metaclass_reg_00352000;
  iVar2 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,0x18,puVar3);
  puVar4 = (undefined8 *)CONCAT44(extraout_var,iVar2);
  *puVar4 = 0;
  puVar4[1] = 0;
  puVar3[1] = puVar4;
  *puVar4 = req;
  if (req != (TadsHttpRequest *)0x0) {
    LOCK();
    pOVar1 = &(req->super_TadsEventMessage).super_TadsMessage.super_CVmRefCntObj.cnt;
    (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + 1;
    UNLOCK();
  }
  *(vm_obj_id_t *)(puVar4 + 2) = server;
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjHTTPRequest::create(
    VMG_ int in_root_set, TadsHttpRequest *req, vm_obj_id_t server)
{
    /* create the object - we have no gc-obj refs of any kind */
    vm_obj_id_t id = vm_new_id(vmg_ in_root_set, FALSE, FALSE);

    /* requests are inherently transient */
    G_obj_table->set_obj_transient(id);

    /* create the C++ object and get its extension */
    CVmObjHTTPRequest *r = new (vmg_ id) CVmObjHTTPRequest(vmg_ TRUE);
    vm_httpreq_ext *ext = r->get_ext();

    /* save the system request object */
    if ((ext->req = req) != 0)
        req->add_ref();

    /* save the server object */
    ext->server = server;

    /* return the new object ID */
    return id;
}